

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

int yaml_parser_scan_to_next_token(yaml_parser_t *parser)

{
  int iVar1;
  bool bVar2;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_34;
  int local_30;
  int local_2c;
  int local_24;
  int local_20;
  int local_1c;
  yaml_parser_t *parser_local;
  
  while( true ) {
    if ((parser->unread == 0) && (iVar1 = yaml_parser_update_buffer(parser,1), iVar1 == 0)) {
      return 0;
    }
    if (((((parser->mark).column == 0) && (*(parser->buffer).pointer == 0xef)) &&
        ((parser->buffer).pointer[1] == 0xbb)) && ((parser->buffer).pointer[2] == 0xbf)) {
      (parser->mark).index = (parser->mark).index + 1;
      (parser->mark).column = (parser->mark).column + 1;
      parser->unread = parser->unread - 1;
      if ((*(parser->buffer).pointer & 0x80) == 0) {
        local_1c = 1;
      }
      else {
        if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
          local_20 = 2;
        }
        else {
          if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
            local_24 = 3;
          }
          else {
            local_24 = 0;
            if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
              local_24 = 4;
            }
          }
          local_20 = local_24;
        }
        local_1c = local_20;
      }
      (parser->buffer).pointer = (parser->buffer).pointer + local_1c;
    }
    if ((parser->unread == 0) && (iVar1 = yaml_parser_update_buffer(parser,1), iVar1 == 0)) break;
    while( true ) {
      bVar2 = true;
      if ((*(parser->buffer).pointer != ' ') &&
         ((parser->flow_level != 0 || (bVar2 = false, parser->simple_key_allowed == 0)))) {
        bVar2 = *(parser->buffer).pointer == '\t';
      }
      if (!bVar2) break;
      (parser->mark).index = (parser->mark).index + 1;
      (parser->mark).column = (parser->mark).column + 1;
      parser->unread = parser->unread - 1;
      if ((*(parser->buffer).pointer & 0x80) == 0) {
        local_2c = 1;
      }
      else {
        if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
          local_30 = 2;
        }
        else {
          if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
            local_34 = 3;
          }
          else {
            local_34 = 0;
            if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
              local_34 = 4;
            }
          }
          local_30 = local_34;
        }
        local_2c = local_30;
      }
      (parser->buffer).pointer = (parser->buffer).pointer + local_2c;
      if ((parser->unread == 0) && (iVar1 = yaml_parser_update_buffer(parser,1), iVar1 == 0)) {
        return 0;
      }
    }
    if (*(parser->buffer).pointer == '#') {
      while( true ) {
        bVar2 = true;
        if ((((*(parser->buffer).pointer != '\r') &&
             (bVar2 = true, *(parser->buffer).pointer != '\n')) &&
            ((*(parser->buffer).pointer != 0xc2 ||
             (bVar2 = true, (parser->buffer).pointer[1] != 0x85)))) &&
           ((((*(parser->buffer).pointer != 0xe2 || ((parser->buffer).pointer[1] != 0x80)) ||
             (bVar2 = true, (parser->buffer).pointer[2] != 0xa8)) &&
            (((*(parser->buffer).pointer != 0xe2 || ((parser->buffer).pointer[1] != 0x80)) ||
             (bVar2 = true, (parser->buffer).pointer[2] != 0xa9)))))) {
          bVar2 = *(parser->buffer).pointer == '\0';
        }
        if (bVar2) break;
        (parser->mark).index = (parser->mark).index + 1;
        (parser->mark).column = (parser->mark).column + 1;
        parser->unread = parser->unread - 1;
        if ((*(parser->buffer).pointer & 0x80) == 0) {
          local_3c = 1;
        }
        else {
          if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
            local_40 = 2;
          }
          else {
            if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
              local_44 = 3;
            }
            else {
              local_44 = 0;
              if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
                local_44 = 4;
              }
            }
            local_40 = local_44;
          }
          local_3c = local_40;
        }
        (parser->buffer).pointer = (parser->buffer).pointer + local_3c;
        if ((parser->unread == 0) && (iVar1 = yaml_parser_update_buffer(parser,1), iVar1 == 0)) {
          return 0;
        }
      }
    }
    if (((((*(parser->buffer).pointer != '\r') && (*(parser->buffer).pointer != '\n')) &&
         ((*(parser->buffer).pointer != 0xc2 || ((parser->buffer).pointer[1] != 0x85)))) &&
        (((*(parser->buffer).pointer != 0xe2 || ((parser->buffer).pointer[1] != 0x80)) ||
         ((parser->buffer).pointer[2] != 0xa8)))) &&
       (((*(parser->buffer).pointer != 0xe2 || ((parser->buffer).pointer[1] != 0x80)) ||
        ((parser->buffer).pointer[2] != 0xa9)))) {
      return 1;
    }
    if ((parser->unread < 2) && (iVar1 = yaml_parser_update_buffer(parser,2), iVar1 == 0)) {
      return 0;
    }
    if ((*(parser->buffer).pointer == '\r') && ((parser->buffer).pointer[1] == '\n')) {
      (parser->mark).index = (parser->mark).index + 2;
      (parser->mark).column = 0;
      (parser->mark).line = (parser->mark).line + 1;
      parser->unread = parser->unread - 2;
      (parser->buffer).pointer = (parser->buffer).pointer + 2;
    }
    else if ((((*(parser->buffer).pointer == '\r') || (*(parser->buffer).pointer == '\n')) ||
             ((*(parser->buffer).pointer == 0xc2 && ((parser->buffer).pointer[1] == 0x85)))) ||
            (((*(parser->buffer).pointer == 0xe2 &&
              (((parser->buffer).pointer[1] == 0x80 && ((parser->buffer).pointer[2] == 0xa8)))) ||
             ((*(parser->buffer).pointer == 0xe2 &&
              (((parser->buffer).pointer[1] == 0x80 && ((parser->buffer).pointer[2] == 0xa9))))))))
    {
      (parser->mark).index = (parser->mark).index + 1;
      (parser->mark).column = 0;
      (parser->mark).line = (parser->mark).line + 1;
      parser->unread = parser->unread - 1;
      if ((*(parser->buffer).pointer & 0x80) == 0) {
        local_48 = 1;
      }
      else {
        if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
          local_4c = 2;
        }
        else {
          if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
            local_50 = 3;
          }
          else {
            local_50 = 0;
            if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
              local_50 = 4;
            }
          }
          local_4c = local_50;
        }
        local_48 = local_4c;
      }
      (parser->buffer).pointer = (parser->buffer).pointer + local_48;
    }
    if (parser->flow_level == 0) {
      parser->simple_key_allowed = 1;
    }
  }
  return 0;
}

Assistant:

static int
yaml_parser_scan_to_next_token(yaml_parser_t *parser)
{
    /* Until the next token is not found. */

    while (1)
    {
        /* Allow the BOM mark to start a line. */

        if (!CACHE(parser, 1)) return 0;

        if (parser->mark.column == 0 && IS_BOM(parser->buffer))
            SKIP(parser);

        /*
         * Eat whitespaces.
         *
         * Tabs are allowed:
         *
         *  - in the flow context;
         *  - in the block context, but not at the beginning of the line or
         *  after '-', '?', or ':' (complex value).
         */

        if (!CACHE(parser, 1)) return 0;

        while (CHECK(parser->buffer,' ') ||
                ((parser->flow_level || !parser->simple_key_allowed) &&
                 CHECK(parser->buffer, '\t'))) {
            SKIP(parser);
            if (!CACHE(parser, 1)) return 0;
        }

        /* Eat a comment until a line break. */

        if (CHECK(parser->buffer, '#')) {
            while (!IS_BREAKZ(parser->buffer)) {
                SKIP(parser);
                if (!CACHE(parser, 1)) return 0;
            }
        }

        /* If it is a line break, eat it. */

        if (IS_BREAK(parser->buffer))
        {
            if (!CACHE(parser, 2)) return 0;
            SKIP_LINE(parser);

            /* In the block context, a new line may start a simple key. */

            if (!parser->flow_level) {
                parser->simple_key_allowed = 1;
            }
        }
        else
        {
            /* We have found a token. */

            break;
        }
    }

    return 1;
}